

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_iterative.c
# Opt level: O0

int SUNQRAdd_ICWY(N_Vector *Q,realtype *R,N_Vector df,int m,int mMax,void *QRdata)

{
  int iVar1;
  int in_ECX;
  long lVar2;
  long in_RSI;
  int in_R8D;
  N_Vector in_R9;
  realtype rVar3;
  SUNQRData qrdata;
  sunindextype k;
  sunindextype j;
  N_Vector in_stack_ffffffffffffffb8;
  N_Vector in_stack_ffffffffffffffc0;
  double c;
  int iVar4;
  int in_stack_ffffffffffffffd4;
  
  N_VScale((realtype)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(N_Vector)0xee9085);
  if (0 < in_ECX) {
    N_VDotProdMulti(in_stack_ffffffffffffffd4,in_R9,(N_Vector *)in_stack_ffffffffffffffc0,
                    (realtype *)in_stack_ffffffffffffffb8);
    (&in_R9->sunctx->profiler)[(in_ECX + -1) * in_R8D + in_ECX + -1] =
         (SUNProfiler)0x3ff0000000000000;
    N_VDotProdMulti(in_stack_ffffffffffffffd4,in_R9,(N_Vector *)in_stack_ffffffffffffffc0,
                    (realtype *)in_stack_ffffffffffffffb8);
    for (iVar4 = 0; iVar1 = iVar4, iVar4 < in_ECX; iVar4 = iVar4 + 1) {
      while (in_stack_ffffffffffffffd4 = iVar1 + 1, in_stack_ffffffffffffffd4 < in_ECX) {
        lVar2 = (long)(in_ECX * in_R8D + in_stack_ffffffffffffffd4);
        *(double *)(in_RSI + lVar2 * 8) =
             -*(double *)(in_RSI + (long)(in_ECX * in_R8D + iVar4) * 8) *
             (double)(&in_R9->sunctx->profiler)[in_stack_ffffffffffffffd4 * in_R8D + iVar4] +
             *(double *)(in_RSI + lVar2 * 8);
        iVar1 = in_stack_ffffffffffffffd4;
      }
    }
    N_VLinearCombination
              (in_stack_ffffffffffffffd4,(realtype *)in_R9,(N_Vector *)in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffb8);
    N_VLinearSum((realtype)CONCAT44(in_stack_ffffffffffffffd4,iVar4),in_R9,
                 (realtype)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(N_Vector)0xee924d);
  }
  rVar3 = N_VDotProd(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (0.0 < rVar3) {
    rVar3 = N_VDotProd(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    c = sqrt(rVar3);
  }
  else {
    c = 0.0;
  }
  *(double *)(in_RSI + (long)(in_ECX * in_R8D + in_ECX) * 8) = c;
  N_VScale(c,in_stack_ffffffffffffffb8,(N_Vector)0xee92f6);
  return 0;
}

Assistant:

int SUNQRAdd_ICWY(N_Vector *Q, realtype *R, N_Vector df,
                  int m, int mMax, void *QRdata)
{
    sunindextype j, k;
    SUNQRData qrdata = (SUNQRData) QRdata;

    N_VScale(ONE, df, qrdata->vtemp); /* stores d_fi in temp */

    if (m > 0) {
      /* T(1:k-1,k-1)^T = Q(:,1:k-1)^T * Q(:,k-1) */
      N_VDotProdMulti(m, Q[m-1], Q, qrdata->temp_array + (m-1) * mMax);

      /* T(k-1,k-1) = 1.0 */
      qrdata->temp_array[(m-1) * mMax + (m-1)] = ONE;

      /* R(1:k-1,k) = Q_k-1^T * df */
      N_VDotProdMulti(m, qrdata->vtemp, Q, R + m * mMax );

      /* Solve T^T * R(1:k-1,k) = R(1:k-1,k) */
      for (k = 0; k < m; k++) {
        /* Skip setting the diagonal element because it doesn't change */
        for (j = k+1; j < m; j++) {
          R[m * mMax + j] -= R[m * mMax + k] * qrdata->temp_array[j * mMax + k];
        }
      }
      /* end */

      /* Q(:,k-1) = df - Q_k-1 R(1:k-1,k) */
      N_VLinearCombination(m, R + m * mMax, Q, qrdata->vtemp2);
      N_VLinearSum(ONE, qrdata->vtemp, -ONE, qrdata->vtemp2, qrdata->vtemp);
    }

    /* R(k,k) = \| df \| */
    R[m * mMax + m] = SUNRsqrt(N_VDotProd(qrdata->vtemp, qrdata->vtemp));
    /* Q(:,k) = df / \| df \| */
    N_VScale((1/R[m * mMax + m]), qrdata->vtemp, Q[m]);

    /* Return success */
    return 0;
}